

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_everything_together.cxx
# Opt level: O0

void __thiscall simple_state_mgr::~simple_state_mgr(simple_state_mgr *this)

{
  state_mgr *in_RDI;
  vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  *unaff_retaddr;
  
  in_RDI->_vptr_state_mgr = (_func_int **)&PTR__simple_state_mgr_00247510;
  std::__cxx11::string::~string((string *)(in_RDI + 5));
  std::
  vector<std::shared_ptr<cornerstone::srv_config>,_std::allocator<std::shared_ptr<cornerstone::srv_config>_>_>
  ::~vector(unaff_retaddr);
  cornerstone::state_mgr::~state_mgr(in_RDI);
  return;
}

Assistant:

simple_state_mgr(int32 srv_id, const std::vector<ptr<srv_config>>& cluster) : srv_id_(srv_id), cluster_(cluster)
    {
        store_path_ = sstrfmt("store%d").fmt(srv_id_);
    }